

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  SegmentBuilder *pSVar1;
  Own<capnp::ClientHook> *in_RCX;
  CapTableBuilder *in_RDX;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  WireHelpers::setCapabilityPointer((SegmentBuilder *)0x0,in_RDX,(WirePointer *)dst,in_RCX);
  pSVar1 = BuilderArena::getSegment((BuilderArena *)src,(SegmentId)0x0);
  *(SegmentBuilder **)(dst + 8) = pSVar1;
  *(CapTableBuilder **)(dst + 0x10) = in_RDX;
  *(EVP_PKEY_CTX **)(dst + 0x18) = dst;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, kj::Own<ClientHook> copyFrom) {
  OrphanBuilder result;
  WireHelpers::setCapabilityPointer(nullptr, capTable, result.tagAsPtr(), kj::mv(copyFrom));
  result.segment = arena->getSegment(SegmentId(0));
  result.capTable = capTable;
  result.location = &result.tag;  // dummy to make location non-null
  return result;
}